

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.h
# Opt level: O2

void __thiscall
Js::RangeBase<Js::SourceFunctionNode>::Add
          (RangeBase<Js::SourceFunctionNode> *this,SourceFunctionNode i,SourceFunctionNode j,
          RangeBase<Js::SourceFunctionNode> *oppositeRange)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  Type *pTVar7;
  SourceFunctionNode SVar8;
  uint *n;
  char *pcVar9;
  undefined8 *in_FS_OFFSET;
  RangeUnit<Js::SourceFunctionNode> unit;
  RangeUnit<Js::SourceFunctionNode> unit_00;
  RangeUnit<Js::SourceFunctionNode> unit_01;
  RangeUnit<Js::SourceFunctionNode> unit_02;
  undefined1 local_90 [8];
  EditingIterator it;
  Unit lowUnit;
  Unit topUnit;
  undefined1 local_40 [8];
  RangeUnit<Js::SourceFunctionNode> a;
  
  n = (uint *)oppositeRange;
  local_40 = (undefined1  [8])i;
  a.i = j;
  SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>::Prepend
            (&this->range,(RangeUnit<Js::SourceFunctionNode> *)local_40);
  if (oppositeRange != (RangeBase<Js::SourceFunctionNode> *)0x0) {
    if ((RangeBase<Js::SourceFunctionNode> *)
        (oppositeRange->range).
        super_SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
        .super_SListNodeBase<Memory::NoCheckHeapAllocator>.next == oppositeRange) {
      _local_90 = GetFullRange<Js::SourceFunctionNode>();
      SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>::Prepend
                (&oppositeRange->range,(RangeUnit<Js::SourceFunctionNode> *)local_90);
    }
    it.super_EditingIterator.super_Iterator.list =
         (SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
          *)oppositeRange;
    local_90 = (undefined1  [8])oppositeRange;
    it.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
    puVar1 = (undefined4 *)*in_FS_OFFSET;
switchD_0020c02e_caseD_0:
    bVar3 = SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
            ::EditingIterator::Next((EditingIterator *)local_90);
    if (bVar3) {
      pTVar7 = SListBase<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>
               ::Iterator::Data((Iterator *)local_90);
      unit.j = i;
      unit.i = pTVar7->j;
      bVar3 = RangeUnitContains<Js::SourceFunctionNode>((Js *)pTVar7->i,unit,(SourceFunctionNode)n);
      unit_00.j = j;
      unit_00.i = pTVar7->j;
      bVar4 = RangeUnitContains<Js::SourceFunctionNode>
                        ((Js *)pTVar7->i,unit_00,(SourceFunctionNode)n);
      unit_01.j = pTVar7->i;
      unit_01.i = a.i;
      bVar5 = RangeUnitContains<Js::SourceFunctionNode>
                        ((Js *)local_40,unit_01,(SourceFunctionNode)n);
      unit_02.j = pTVar7->j;
      unit_02.i = a.i;
      bVar6 = RangeUnitContains<Js::SourceFunctionNode>
                        ((Js *)local_40,unit_02,(SourceFunctionNode)n);
      n = &switchD_0020c02e::switchdataD_002f4754;
      switch(bVar3 + bVar4 * '\x02' + bVar5 * '\x04' + bVar6 * '\b') {
      case '\0':
        break;
      default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar1 = 1;
        pcVar9 = "UNREACHED";
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.h"
                                    ,0x3c4,"((0))","UNREACHED");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar1 = 0;
        n = (uint *)pcVar9;
        break;
      case '\x03':
        it.super_EditingIterator.last = *(NodeBase **)&pTVar7->i;
        lowUnit.i = pTVar7->j;
        lowUnit.j = pTVar7->i;
        lowUnit.i = GetPrevious<Js::SourceFunctionNode>((SourceFunctionNode)local_40);
        lowUnit.j = GetNext<Js::SourceFunctionNode>(a.i);
        SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>::
        EditingIterator::InsertBefore
                  ((EditingIterator *)local_90,
                   (RangeUnit<Js::SourceFunctionNode> *)&it.super_EditingIterator.last);
        SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>::
        EditingIterator::InsertBefore
                  ((EditingIterator *)local_90,(RangeUnit<Js::SourceFunctionNode> *)&lowUnit.j);
      case '\f':
      case '\r':
      case '\x0e':
      case '\x0f':
        SList<Js::RangeUnit<Js::SourceFunctionNode>,_Memory::NoCheckHeapAllocator,_RealCount>::
        EditingIterator::RemoveCurrent((EditingIterator *)local_90);
        break;
      case '\x06':
      case '\a':
        SVar8 = GetNext<Js::SourceFunctionNode>(a.i);
        pTVar7->i = SVar8;
        break;
      case '\t':
      case '\v':
        SVar8 = GetPrevious<Js::SourceFunctionNode>((SourceFunctionNode)local_40);
        pTVar7->j = SVar8;
      }
      goto switchD_0020c02e_caseD_0;
    }
  }
  return;
}

Assistant:

void
RangeBase<TRangeUnitData>::Add(TRangeUnitData i, TRangeUnitData j, RangeBase<TRangeUnitData>* oppositeRange)
{
    RangeUnit<TRangeUnitData> a(i, j);
    range.Prepend(a);
    if (oppositeRange)
    {
        if (oppositeRange->range.Empty())
        {
            oppositeRange->range.Prepend(GetFullRange<TRangeUnitData>());
        }
        // Do an intersection
        auto it = oppositeRange->range.GetEditingIterator();
        while (it.Next())
        {
            Unit& unit = it.Data();
            bool c1 = RangeUnitContains(unit, i);
            bool c2 = RangeUnitContains(unit, j);
            bool c3 = RangeUnitContains(a, unit.i);
            bool c4 = RangeUnitContains(a, unit.j);
            enum IntersectionCase
            {
                NoIntersection = 0,
                AddedFullyContained = 3, // [ u [a] ]
                IntersectionAdded_Unit = 6, // [ a [ ] u ]
                CommonLowBound_Unit = 7, // [[ a ] u ]
                IntersectionUnit_Added = 9, // [ u [ ] a ]
                CommonTopBound_Unit = 11, // [ u [ a ]]
                UnitFullyContained = 12, // [ a [u] ]
                CommonLowBound_Added = 13, // [[ u ] a ]
                CommonTopBound_Added = 14, // [ a [ u ]]
                FullIntersection = 15 // [[a, u]]
            };
            IntersectionCase intersectionCase = (IntersectionCase)((int)c1 | (c2 << 1) | (c3 << 2) | (c4 << 3));
            switch (intersectionCase)
            {
            case NoIntersection:
                // Nothing to do
                break;
            case AddedFullyContained:
            {
                // Need to break the current in 2
                Unit lowUnit = unit;
                Unit topUnit = unit;
                lowUnit.j = GetPrevious(a.i);
                topUnit.i = GetNext(a.j);
                it.InsertBefore(lowUnit);
                it.InsertBefore(topUnit);
                it.RemoveCurrent();
                break;
            }
            case IntersectionAdded_Unit:
            case CommonLowBound_Unit:
                // Move the unit lower bound after the added upper bound
                unit.i = GetNext(a.j);
                break;
            case IntersectionUnit_Added:
            case CommonTopBound_Unit:
                // Move the unit upper bound before the added lower bound
                unit.j = GetPrevious(a.i);
                break;
            case CommonTopBound_Added:
            case CommonLowBound_Added:
            case UnitFullyContained:
            case FullIntersection:
                // Remove the unit
                it.RemoveCurrent();
                break;
            default:
                Assert(UNREACHED);
                break;
            }
        }
    }
}